

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

bool __thiscall
Lowerer::TryGenerateFastBrSrXx
          (Lowerer *this,Instr *instr,RegOpnd *srcReg1,RegOpnd *srcReg2,Instr **pInstrPrev,
          bool noMathFastPath)

{
  bool bVar1;
  bool bVar2;
  BranchInstr *pBVar3;
  Opnd *pOVar4;
  bool isEqual;
  bool noMathFastPath_local;
  Instr **pInstrPrev_local;
  RegOpnd *srcReg2_local;
  RegOpnd *srcReg1_local;
  Instr *instr_local;
  Lowerer *this_local;
  
  bVar1 = IR::Instr::IsNeq(instr);
  bVar1 = (bool)((bVar1 ^ 0xffU) & 1);
  if ((srcReg2 == (RegOpnd *)0x0) || (bVar2 = IsConstRegOpnd(this,srcReg2), !bVar2)) {
    if ((srcReg1 == (RegOpnd *)0x0) || (bVar2 = IsConstRegOpnd(this,srcReg1), !bVar2)) {
      this_local._7_1_ = false;
    }
    else {
      IR::Instr::SwapOpnds(instr);
      pBVar3 = IR::Instr::AsBranchInstr(instr);
      pOVar4 = GetConstRegOpnd(this,srcReg1,instr);
      GenerateFastBrConst(this,pBVar3,pOVar4,bVar1);
      IR::Instr::Remove(instr);
      this_local._7_1_ = true;
    }
  }
  else {
    pBVar3 = IR::Instr::AsBranchInstr(instr);
    pOVar4 = GetConstRegOpnd(this,srcReg2,instr);
    GenerateFastBrConst(this,pBVar3,pOVar4,bVar1);
    IR::Instr::Remove(instr);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool
Lowerer::TryGenerateFastBrSrXx(IR::Instr * instr, IR::RegOpnd * srcReg1, IR::RegOpnd * srcReg2, IR::Instr ** pInstrPrev, bool noMathFastPath)
{
    bool isEqual = !instr->IsNeq();

    if (srcReg2 && IsConstRegOpnd(srcReg2))
    {
        this->GenerateFastBrConst(instr->AsBranchInstr(), GetConstRegOpnd(srcReg2, instr), isEqual);
        instr->Remove();
        return true;
    }
    else if (srcReg1 && IsConstRegOpnd(srcReg1))
    {
        instr->SwapOpnds();
        this->GenerateFastBrConst(instr->AsBranchInstr(), GetConstRegOpnd(srcReg1, instr), isEqual);
        instr->Remove();
        return true;
    }

    return false;
}